

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall YAML::Parser::PrintTokens(Parser *this,ostream *out)

{
  _Head_base<0UL,_YAML::Scanner_*,_false> this_00;
  bool bVar1;
  Token *token;
  ostream *poVar2;
  
  this_00._M_head_impl =
       (this->m_pScanner)._M_t.
       super___uniq_ptr_impl<YAML::Scanner,_std::default_delete<YAML::Scanner>_>._M_t.
       super__Tuple_impl<0UL,_YAML::Scanner_*,_std::default_delete<YAML::Scanner>_>.
       super__Head_base<0UL,_YAML::Scanner_*,_false>._M_head_impl;
  if (this_00._M_head_impl != (Scanner *)0x0) {
    bVar1 = Scanner::empty(this_00._M_head_impl);
    while (!bVar1) {
      token = Scanner::peek((this->m_pScanner)._M_t.
                            super___uniq_ptr_impl<YAML::Scanner,_std::default_delete<YAML::Scanner>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_YAML::Scanner_*,_std::default_delete<YAML::Scanner>_>
                            .super__Head_base<0UL,_YAML::Scanner_*,_false>._M_head_impl);
      poVar2 = operator<<(out,token);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      Scanner::pop((this->m_pScanner)._M_t.
                   super___uniq_ptr_impl<YAML::Scanner,_std::default_delete<YAML::Scanner>_>._M_t.
                   super__Tuple_impl<0UL,_YAML::Scanner_*,_std::default_delete<YAML::Scanner>_>.
                   super__Head_base<0UL,_YAML::Scanner_*,_false>._M_head_impl);
      bVar1 = Scanner::empty((this->m_pScanner)._M_t.
                             super___uniq_ptr_impl<YAML::Scanner,_std::default_delete<YAML::Scanner>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_YAML::Scanner_*,_std::default_delete<YAML::Scanner>_>
                             .super__Head_base<0UL,_YAML::Scanner_*,_false>._M_head_impl);
    }
  }
  return;
}

Assistant:

void Parser::PrintTokens(std::ostream& out) {
  if (!m_pScanner) {
    return;
  }

  while (!m_pScanner->empty()) {
    out << m_pScanner->peek() << "\n";
    m_pScanner->pop();
  }
}